

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

GeneratedMessageFactory *
google::protobuf::anon_unknown_19::GeneratedMessageFactory::singleton(void)

{
  int iVar1;
  GeneratedMessageFactory *this;
  
  if (protobuf::(anonymous_namespace)::GeneratedMessageFactory::singleton()::instance == '\0') {
    iVar1 = __cxa_guard_acquire(&protobuf::(anonymous_namespace)::GeneratedMessageFactory::
                                 singleton()::instance);
    if (iVar1 != 0) {
      this = (GeneratedMessageFactory *)operator_new(0x90);
      GeneratedMessageFactory(this);
      singleton::instance =
           internal::
           OnShutdownDelete<google::protobuf::(anonymous_namespace)::GeneratedMessageFactory>(this);
      __cxa_guard_release(&protobuf::(anonymous_namespace)::GeneratedMessageFactory::singleton()::
                           instance);
    }
  }
  return singleton::instance;
}

Assistant:

GeneratedMessageFactory* GeneratedMessageFactory::singleton() {
  static auto instance =
      internal::OnShutdownDelete(new GeneratedMessageFactory);
  return instance;
}